

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.cpp
# Opt level: O2

int read_proc(void)

{
  bool bVar1;
  int number;
  
  number = 0;
  while (result <= g_maxCount) {
    bVar1 = spsc_queue<int>::try_dequeue(&q,&number);
    if (bVar1) {
      result = number;
    }
    else {
      usleep(1);
    }
  }
  return 0;
}

Assistant:

int read_proc()
{
    int number = 0 ; 
    // You can also peek at the front item of the queue (consumer only)
    while(result <= g_maxCount)
    {
	//int* front = q.peek();
	bool ret = q.try_dequeue(number); 
	if (ret)
	{
	    Log("result is "<< result << " num is " << number ); 
	    result = number; 
	}
	else 
	{
	    usleep(1); 
	}
    }
    Log(" read finished " ); ; 


    return 0; 
}